

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_scriptsig_multisig_from_bytes
              (uchar *script,size_t script_len,uchar *bytes,size_t bytes_len,uint32_t *sighash,
              size_t sighash_len,uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  int local_524;
  int ret;
  size_t n_sigs;
  size_t required;
  size_t i;
  size_t der_len [15];
  uchar *p;
  uchar der_buff [1095];
  size_t sighash_len_local;
  uint32_t *sighash_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  size_t script_len_local;
  uchar *script_local;
  
  der_len[0xe] = (size_t)bytes_out;
  n_sigs = 0;
  uVar1 = bytes_len >> 6;
  local_524 = 0;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (((((script == (uchar *)0x0) || (script_len == 0)) || (bytes == (uchar *)0x0)) ||
      ((((bytes_len == 0 || ((bytes_len & 0x3f) != 0)) ||
        ((uVar1 == 0 || ((0xf < uVar1 || (sighash == (uint32_t *)0x0)))))) || (sighash_len != uVar1)
       ))) || (((flags != 0 || (bytes_out == (uchar *)0x0)) || (written == (size_t *)0x0)))) {
    script_local._4_4_ = -2;
  }
  else {
    unique0x1000033a = sighash_len;
    for (required = 0; required < uVar1; required = required + 1) {
      if ((sighash[required] & 0xffffff00) != 0) {
        local_524 = -2;
        goto LAB_001360cc;
      }
      local_524 = wally_ec_sig_to_der(bytes + required * 0x40,0x40,der_buff + required * 0x49 + -8,
                                      0x49,der_len + (required - 1));
      if (local_524 != 0) goto LAB_001360cc;
      der_buff[required * 0x49 + der_len[required - 1] + -8] = (uchar)sighash[required];
      der_len[required - 1] = der_len[required - 1] + 1;
      sVar2 = script_get_push_size(der_len[required - 1]);
      n_sigs = sVar2 + n_sigs;
    }
    sVar3 = script_get_push_size(script_len);
    sVar2 = der_len[0xe];
    uVar4 = sVar3 + 1 + n_sigs;
    if (len < uVar4) {
      *written = uVar4;
    }
    else {
      der_len[0xe] = der_len[0xe] + 1;
      *(undefined1 *)sVar2 = 0;
      len = len - 1;
      for (required = 0; required < uVar1; required = required + 1) {
        local_524 = wally_script_push_from_bytes
                              (der_buff + required * 0x49 + -8,der_len[required - 1],0,
                               (uchar *)der_len[0xe],len,der_len + (required - 1));
        if (local_524 != 0) goto LAB_001360cc;
        der_len[0xe] = der_len[required - 1] + der_len[0xe];
        len = len - der_len[required - 1];
      }
      local_524 = wally_script_push_from_bytes(script,script_len,0,(uchar *)der_len[0xe],len,&i);
      if (local_524 == 0) {
        if (len < i) {
          return -1;
        }
        *written = uVar4;
      }
    }
LAB_001360cc:
    wally_clear(&p,0x447);
    script_local._4_4_ = local_524;
  }
  return script_local._4_4_;
}

Assistant:

int wally_scriptsig_multisig_from_bytes(
    const unsigned char *script, size_t script_len,
    const unsigned char *bytes, size_t bytes_len,
    const uint32_t *sighash, size_t sighash_len, uint32_t flags,
    unsigned char *bytes_out, size_t len, size_t *written)
{
#define MAX_DER (EC_SIGNATURE_DER_MAX_LEN + 1)
    unsigned char der_buff[15 * MAX_DER], *p = bytes_out;
    size_t der_len[15];
    size_t i, required = 0, n_sigs = bytes_len / EC_SIGNATURE_LEN;
    int ret = WALLY_OK;

    if (written)
        *written = 0;

    if (!script || !script_len || !bytes || !bytes_len || bytes_len % EC_SIGNATURE_LEN ||
        n_sigs < 1 || n_sigs > 15 || !sighash || sighash_len != n_sigs ||
        flags || !bytes_out || !written)
        return WALLY_EINVAL;

    /* Create and store the DER encoded signatures with lengths */
    for (i = 0; i < n_sigs; ++i) {
        if (sighash[i] & ~0xff) {
            ret = WALLY_EINVAL;
            goto cleanup;
        }
        ret = wally_ec_sig_to_der(bytes + i * EC_SIGNATURE_LEN, EC_SIGNATURE_LEN,
                                  &der_buff[i * MAX_DER], MAX_DER, &der_len[i]);
        if (ret != WALLY_OK)
            goto cleanup;
        der_buff[i * MAX_DER + der_len[i]] = sighash[i] & 0xff;
        ++der_len[i];
        required += script_get_push_size(der_len[i]);
    }

    /* Account for the initial OP_0 and final script push */
    required += 1 + script_get_push_size(script_len);

    if (len < required) {
        *written = required;
        goto cleanup;
    }

    *p++ = OP_0;
    len--;
    for (i = 0; i < n_sigs; ++i) {
        ret = wally_script_push_from_bytes(&der_buff[i * MAX_DER], der_len[i],
                                           0, p, len, &der_len[i]);
        if (ret != WALLY_OK)
            goto cleanup;
        p += der_len[i];
        len -= der_len[i];
    }
    ret = wally_script_push_from_bytes(script, script_len,
                                       0, p, len, &der_len[0]);
    if (ret != WALLY_OK)
        goto cleanup;
    if (len < der_len[0])
        return WALLY_ERROR; /* Required length mismatch, should not happen! */
    *written = required;

cleanup:
    wally_clear(der_buff, sizeof(der_buff));
    return ret;
}